

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  type_conflict5 tVar13;
  bool bVar14;
  long lVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  int *piVar17;
  int iVar18;
  int local_1ac;
  cpp_dec_float<50U,_int,_void> local_1a8;
  int local_164;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  cpp_dec_float<50U,_int,_void> local_158;
  int *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  int *local_110;
  int *local_108;
  int *local_100;
  pointer local_f8;
  long local_f0;
  long local_e8;
  cpp_dec_float<50U,_int,_void> local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_f8 = (this->l).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_100 = (this->l).idx;
  local_108 = (this->l).row;
  local_110 = (this->l).start;
  local_f0 = (long)(this->l).firstUpdate;
  local_e8 = (long)(this->l).firstUnused;
  local_1ac = n;
  local_120 = nonz;
  local_118 = eps;
  while (local_f0 < local_e8) {
    lVar15 = local_e8 + -1;
    iVar2 = local_108[lVar15];
    uVar6 = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 8);
    local_1a8.data._M_elems[8] = (uint)uVar6;
    local_1a8.data._M_elems[9] = (uint)((ulong)uVar6 >> 0x20);
    uVar6 = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
    uVar7 = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    local_1a8.data._M_elems[4] = (uint)uVar8;
    local_1a8.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
    local_1a8.data._M_elems[6] = (uint)uVar9;
    local_1a8.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
    local_1a8.data._M_elems[0] = (uint)uVar6;
    local_1a8.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
    local_1a8.data._M_elems[2] = (uint)uVar7;
    local_1a8.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
    local_1a8.exp = vec[iVar2].m_backend.exp;
    local_1a8.neg = vec[iVar2].m_backend.neg;
    local_1a8.fpclass = vec[iVar2].m_backend.fpclass;
    local_1a8.prec_elem = vec[iVar2].m_backend.prec_elem;
    local_e0.data._M_elems[9] = vec[iVar2].m_backend.data._M_elems[9];
    puVar1 = vec[iVar2].m_backend.data._M_elems + 1;
    local_e0.data._M_elems._4_8_ = *(undefined8 *)puVar1;
    local_e0.data._M_elems._12_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 5;
    local_e0.data._M_elems._20_8_ = *(undefined8 *)puVar1;
    local_e0.data._M_elems._28_8_ = *(undefined8 *)(puVar1 + 2);
    local_e0.data._M_elems[0] = local_1a8.data._M_elems[0];
    local_e0.neg = (bool)((local_1a8.data._M_elems[0] != 0 ||
                          local_1a8.fpclass != cpp_dec_float_finite) ^ local_1a8.neg);
    piVar17 = local_100 + local_110[lVar15];
    local_160 = vec + iVar2;
    iVar18 = local_110[local_e8];
    pcVar16 = &local_f8[local_110[lVar15]].m_backend;
    local_e8 = lVar15;
    local_e0.exp = local_1a8.exp;
    local_e0.fpclass = local_1a8.fpclass;
    local_e0.prec_elem = local_1a8.prec_elem;
    for (; iVar2 < iVar18; iVar18 = iVar18 + -1) {
      iVar3 = *piVar17;
      piVar17 = piVar17 + 1;
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems._24_5_ = 0;
      local_158.data._M_elems[7]._1_3_ = 0;
      local_158.data._M_elems._32_5_ = 0;
      local_158.data._M_elems[9]._1_3_ = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_158,&vec[iVar3].m_backend,pcVar16);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_e0,&local_158);
      pcVar16 = pcVar16 + 1;
    }
    local_158.data._M_elems._0_8_ = local_158.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar13 = boost::multiprecision::operator==
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_1a8,(int *)&local_158);
    local_1a8.data._M_elems[9] = local_e0.data._M_elems[9];
    local_1a8.data._M_elems[5] = local_e0.data._M_elems[5];
    local_1a8.data._M_elems[6] = local_e0.data._M_elems[6];
    local_1a8.data._M_elems[7] = local_e0.data._M_elems[7];
    local_1a8.data._M_elems[8] = local_e0.data._M_elems[8];
    local_1a8.data._M_elems[1] = local_e0.data._M_elems[1];
    local_1a8.data._M_elems[2] = local_e0.data._M_elems[2];
    local_1a8.data._M_elems[3] = local_e0.data._M_elems[3];
    local_1a8.data._M_elems[4] = local_e0.data._M_elems[4];
    local_1a8.data._M_elems[0] = local_e0.data._M_elems[0];
    local_1a8.neg =
         (bool)((local_e0.data._M_elems[0] != 0 || local_e0.fpclass != cpp_dec_float_finite) ^
               local_e0.neg);
    local_1a8.exp = local_e0.exp;
    local_1a8.fpclass = local_e0.fpclass;
    local_1a8.prec_elem = local_e0.prec_elem;
    if (tVar13) {
      local_a8.m_backend.data._M_elems[9] = local_e0.data._M_elems[9];
      local_a8.m_backend.data._M_elems[8] = local_1a8.data._M_elems[8];
      local_a8.m_backend.data._M_elems[1] = local_e0.data._M_elems[1];
      local_a8.m_backend.data._M_elems[2] = local_e0.data._M_elems[2];
      local_a8.m_backend.data._M_elems[5] = local_1a8.data._M_elems[5];
      local_a8.m_backend.data._M_elems[4] = local_1a8.data._M_elems[4];
      local_a8.m_backend.data._M_elems[7] = local_1a8.data._M_elems[7];
      local_a8.m_backend.data._M_elems[6] = local_1a8.data._M_elems[6];
      local_a8.m_backend.data._M_elems[0] = local_e0.data._M_elems[0];
      local_a8.m_backend.data._M_elems[3] = local_1a8.data._M_elems[3];
      local_a8.m_backend.exp = local_e0.exp;
      local_a8.m_backend.fpclass = local_e0.fpclass;
      local_a8.m_backend.prec_elem = local_e0.prec_elem;
      local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_118->m_backend).data._M_elems;
      local_68.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_118->m_backend).data._M_elems + 2);
      local_68.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_118->m_backend).data._M_elems + 4);
      local_68.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_118->m_backend).data._M_elems + 6);
      local_68.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_118->m_backend).data._M_elems + 8);
      local_68.m_backend.exp = (local_118->m_backend).exp;
      local_68.m_backend.neg = (local_118->m_backend).neg;
      local_68.m_backend.fpclass = (local_118->m_backend).fpclass;
      local_68.m_backend.prec_elem = (local_118->m_backend).prec_elem;
      local_a8.m_backend.neg = local_1a8.neg;
      bVar14 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_a8,&local_68);
      if (bVar14) {
        lVar15 = (long)local_1ac;
        local_1ac = local_1ac + 1;
        local_120[lVar15] = iVar2;
        *(ulong *)((local_160->m_backend).data._M_elems + 8) =
             CONCAT44(local_1a8.data._M_elems[9],local_1a8.data._M_elems[8]);
        *(ulong *)((local_160->m_backend).data._M_elems + 4) =
             CONCAT44(local_1a8.data._M_elems[5],local_1a8.data._M_elems[4]);
        *(ulong *)((local_160->m_backend).data._M_elems + 6) =
             CONCAT44(local_1a8.data._M_elems[7],local_1a8.data._M_elems[6]);
        *(ulong *)(local_160->m_backend).data._M_elems =
             CONCAT44(local_1a8.data._M_elems[1],local_1a8.data._M_elems[0]);
        *(ulong *)((local_160->m_backend).data._M_elems + 2) =
             CONCAT44(local_1a8.data._M_elems[3],local_1a8.data._M_elems[2]);
        (local_160->m_backend).exp = local_1a8.exp;
        (local_160->m_backend).neg = local_1a8.neg;
        (local_160->m_backend).fpclass = local_1a8.fpclass;
        (local_160->m_backend).prec_elem = local_1a8.prec_elem;
      }
    }
    else {
      local_164 = 0;
      tVar13 = boost::multiprecision::operator!=
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1a8,&local_164);
      if (tVar13) {
        local_158.data._M_elems._32_5_ =
             SUB85(CONCAT44(local_1a8.data._M_elems[9],local_1a8.data._M_elems[8]),0);
        local_158.data._M_elems[9]._1_3_ = (undefined3)(local_1a8.data._M_elems[9] >> 8);
        local_158.data._M_elems[4] = local_1a8.data._M_elems[4];
        local_158.data._M_elems[5] = local_1a8.data._M_elems[5];
        local_158.data._M_elems._24_5_ =
             SUB85(CONCAT44(local_1a8.data._M_elems[7],local_1a8.data._M_elems[6]),0);
        local_158.data._M_elems[7]._1_3_ = (undefined3)(local_1a8.data._M_elems[7] >> 8);
        local_158.data._M_elems[0] = local_1a8.data._M_elems[0];
        local_158.data._M_elems[1] = local_1a8.data._M_elems[1];
        local_158.data._M_elems[2] = local_1a8.data._M_elems[2];
        local_158.data._M_elems[3] = local_1a8.data._M_elems[3];
        pcVar16 = &local_1a8;
        pcVar10 = &local_1a8;
        pcVar11 = &local_1a8;
        pcVar12 = &local_1a8;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_158,1e-100,(type *)0x0);
        pcVar16 = &local_158;
        pcVar10 = &local_158;
        pcVar11 = &local_158;
        pcVar12 = &local_158;
      }
      iVar2 = pcVar16->exp;
      bVar14 = pcVar10->neg;
      fVar4 = pcVar11->fpclass;
      iVar5 = pcVar12->prec_elem;
      *(ulong *)((local_160->m_backend).data._M_elems + 8) =
           CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
      *(undefined8 *)((local_160->m_backend).data._M_elems + 4) = local_158.data._M_elems._16_8_;
      *(ulong *)((local_160->m_backend).data._M_elems + 6) =
           CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_);
      *(undefined8 *)(local_160->m_backend).data._M_elems = local_158.data._M_elems._0_8_;
      *(undefined8 *)((local_160->m_backend).data._M_elems + 2) = local_158.data._M_elems._8_8_;
      (local_160->m_backend).exp = iVar2;
      (local_160->m_backend).neg = bVar14;
      (local_160->m_backend).fpclass = fVar4;
      (local_160->m_backend).prec_elem = iVar5;
    }
  }
  return local_1ac;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}